

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

void Cec_ManSimProcessRefined(Cec_ManSim_t *p,Vec_Int_t *vRefined)

{
  uint *puVar1;
  Gia_Man_t *p_00;
  ulong uVar2;
  uint uVar3;
  int Id;
  int iVar4;
  int iVar5;
  Gia_Rpr_t GVar6;
  int iVar7;
  void *__ptr;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint nTableSize;
  long lVar11;
  
  iVar7 = vRefined->nSize;
  if (iVar7 == 0) {
    return;
  }
  uVar10 = iVar7 / 3 + 99;
  do {
    do {
      nTableSize = uVar10 + 1;
      uVar3 = uVar10 & 1;
      uVar10 = nTableSize;
    } while (uVar3 != 0);
    uVar9 = 3;
    do {
      iVar8 = (int)uVar9;
      if (nTableSize < (uint)(iVar8 * iVar8)) {
        __ptr = calloc((long)(int)nTableSize,4);
        iVar8 = 0;
        do {
          if (iVar7 <= iVar8) {
            for (iVar8 = 0; iVar8 < iVar7; iVar8 = iVar8 + 1) {
              iVar7 = Vec_IntEntry(vRefined,iVar8);
              iVar5 = Gia_ObjIsHead(p->pAig,iVar7);
              if (iVar5 != 0) {
                Cec_ManSimClassRefineOne(p,iVar7);
              }
              iVar7 = vRefined->nSize;
            }
            for (iVar8 = 0; iVar8 < iVar7; iVar8 = iVar8 + 1) {
              iVar7 = Vec_IntEntry(vRefined,iVar8);
              Cec_ManSimSimDeref(p,iVar7);
              iVar7 = vRefined->nSize;
            }
            free(__ptr);
            return;
          }
          Id = Vec_IntEntry(vRefined,iVar8);
          puVar1 = p->pMems;
          iVar7 = p->pSimInfo[Id];
          iVar5 = p->nWords;
          iVar4 = Cec_ManSimCompareConst(puVar1 + (long)iVar7 + 1,iVar5);
          if (iVar4 != 0) {
            __assert_fail("!Cec_ManSimCompareConst( pSim, p->nWords )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                          ,0x1de,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
          }
          iVar5 = Cec_ManSimHashKey(puVar1 + (long)iVar7 + 1,iVar5,nTableSize);
          iVar7 = *(int *)((long)__ptr + (long)iVar5 * 4);
          lVar11 = (long)iVar7;
          p_00 = p->pAig;
          if (lVar11 == 0) {
            GVar6 = p_00->pReprs[Id];
            if (((uint)GVar6 & 0xfffffff) != 0) {
              __assert_fail("Gia_ObjRepr(p->pAig, i) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                            ,0x1e2,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
            }
            if (p_00->pNexts[Id] != 0) {
              __assert_fail("Gia_ObjNext(p->pAig, i) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                            ,0x1e3,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
            }
            p_00->pReprs[Id] = (Gia_Rpr_t)((uint)GVar6 | 0xfffffff);
          }
          else {
            p_00->pNexts[lVar11] = Id;
            Gia_ObjSetRepr(p_00,Id,(uint)p_00->pReprs[lVar11] & 0xfffffff);
            GVar6 = p->pAig->pReprs[Id];
            if ((~(uint)GVar6 & 0xfffffff) == 0) {
              Gia_ObjSetRepr(p->pAig,Id,iVar7);
              GVar6 = p->pAig->pReprs[Id];
            }
            if (((uint)GVar6 & 0xfffffff) == 0) {
              __assert_fail("Gia_ObjRepr(p->pAig, i) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                            ,0x1ec,"void Cec_ManSimProcessRefined(Cec_ManSim_t *, Vec_Int_t *)");
            }
          }
          *(int *)((long)__ptr + (long)iVar5 * 4) = Id;
          iVar8 = iVar8 + 1;
          iVar7 = vRefined->nSize;
        } while( true );
      }
      uVar2 = (ulong)nTableSize % uVar9;
      uVar9 = (ulong)(iVar8 + 2);
    } while ((int)uVar2 != 0);
  } while( true );
}

Assistant:

void Cec_ManSimProcessRefined( Cec_ManSim_t * p, Vec_Int_t * vRefined )
{
    unsigned * pSim;
    int * pTable, nTableSize, i, k, Key;
    if ( Vec_IntSize(vRefined) == 0 )
        return;
    nTableSize = Abc_PrimeCudd( 100 + Vec_IntSize(vRefined) / 3 );
    pTable = ABC_CALLOC( int, nTableSize );
    Vec_IntForEachEntry( vRefined, i, k )
    {
        pSim = Cec_ObjSim( p, i );
        assert( !Cec_ManSimCompareConst( pSim, p->nWords ) );
        Key = Cec_ManSimHashKey( pSim, p->nWords, nTableSize );
        if ( pTable[Key] == 0 )
        {
            assert( Gia_ObjRepr(p->pAig, i) == 0 );
            assert( Gia_ObjNext(p->pAig, i) == 0 );
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        }
        else
        {
            Gia_ObjSetNext( p->pAig, pTable[Key], i );
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjRepr(p->pAig, pTable[Key]) );
            if ( Gia_ObjRepr(p->pAig, i) == GIA_VOID )
                Gia_ObjSetRepr( p->pAig, i, pTable[Key] );
            assert( Gia_ObjRepr(p->pAig, i) > 0 );
        }
        pTable[Key] = i;
    }
    Vec_IntForEachEntry( vRefined, i, k )
    {
        if ( Gia_ObjIsHead( p->pAig, i ) )
            Cec_ManSimClassRefineOne( p, i );
    }
    Vec_IntForEachEntry( vRefined, i, k )
        Cec_ManSimSimDeref( p, i );
    ABC_FREE( pTable );
}